

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O2

void __thiscall kratos::InstantiationStmt::InstantiationStmt(InstantiationStmt *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_InstantiationStmt = (_func_int **)&PTR___cxa_pure_virtual_002a6de0;
  p_Var1 = &(this->port_mapping_)._M_t._M_impl.super__Rb_tree_header;
  (this->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->port_mapping_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->port_debug_)._M_t._M_impl.super__Rb_tree_header;
  (this->port_debug_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->port_debug_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->port_debug_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->port_debug_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->port_debug_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->connection_stmt_)._M_h._M_buckets = &(this->connection_stmt_)._M_h._M_single_bucket;
  (this->connection_stmt_)._M_h._M_bucket_count = 1;
  (this->connection_stmt_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->connection_stmt_)._M_h._M_element_count = 0;
  (this->connection_stmt_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->connection_stmt_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->connection_stmt_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

const std::map<Var *, Stmt *> &port_debug() const { return port_debug_; }